

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllTargetsStore::WriteMS<tcu::Vector<unsigned_int,4>>
          (BasicAllTargetsStore *this,GLenum internalformat,Vector<unsigned_int,_4> *write_value,
          Vector<unsigned_int,_4> *expected_value)

{
  CallLogWrapper *this_00;
  BasicAllTargetsStore *this_01;
  bool bVar1;
  GLuint GVar2;
  GLuint program;
  GLint GVar3;
  ostream *poVar4;
  undefined4 in_register_00000034;
  Vector<unsigned_int,_4> *vec;
  int h;
  vec4 *expected;
  GLuint textures [2];
  long local_3c8;
  undefined1 local_3c0;
  char *local_3b8;
  undefined8 local_3b0;
  undefined2 local_3a8;
  undefined6 uStack_3a6;
  char *local_398;
  undefined8 local_390;
  undefined2 local_388;
  undefined6 uStack_386;
  char *local_378;
  undefined8 local_370;
  undefined2 local_368;
  undefined6 uStack_366;
  char *local_358;
  undefined8 local_350;
  undefined2 local_348;
  undefined6 uStack_346;
  char *local_338;
  undefined8 local_330;
  undefined2 local_328;
  undefined6 uStack_326;
  char *local_318;
  undefined8 local_310;
  undefined2 local_308;
  undefined6 uStack_306;
  char *local_2f8;
  undefined8 local_2f0;
  undefined2 local_2e8;
  undefined6 uStack_2e6;
  char *local_2d8;
  undefined8 local_2d0;
  undefined2 local_2c8;
  undefined6 uStack_2c6;
  char *local_2b8;
  undefined8 local_2b0;
  undefined2 local_2a8;
  undefined6 uStack_2a6;
  long *local_298;
  undefined8 local_290;
  long local_288;
  undefined1 local_280;
  char *local_278;
  undefined8 local_270;
  undefined2 local_268;
  undefined6 uStack_266;
  BasicAllTargetsStore *local_258;
  GLuint local_24c;
  char *local_248;
  undefined8 local_240;
  undefined2 local_238;
  undefined6 uStack_236;
  char *local_228;
  undefined8 local_220;
  undefined2 local_218;
  undefined6 uStack_216;
  char *local_208;
  undefined8 local_200;
  undefined2 local_1f8;
  undefined6 uStack_1f6;
  long *local_1e8;
  long local_1d8 [2];
  char *local_1c8;
  undefined8 local_1c0;
  undefined2 local_1b8;
  undefined6 uStack_1b6;
  ostringstream os;
  
  vec = (Vector<unsigned_int,_4> *)CONCAT44(in_register_00000034,internalformat);
  local_258 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&os,"#version 420 core\nlayout(",0x19);
  textures = (GLuint  [2])&local_3c8;
  local_3c8 = 0x6975323361626772;
  local_3c0 = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,(char *)textures,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") writeonly uniform ",0x14);
  local_278 = (char *)&local_268;
  local_268 = 0x75;
  local_270 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_278,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"image2DMS g_image_2dms;\nlayout(",0x1f)
  ;
  local_298 = &local_288;
  local_288 = 0x6975323361626772;
  local_290 = 8;
  local_280 = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_298,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") writeonly uniform ",0x14);
  local_2b8 = (char *)&local_2a8;
  local_2a8 = 0x75;
  local_2b0 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2b8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "image2DMSArray g_image_2dms_array;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_2dms, coord, 0, "
             ,0x7e);
  local_2d8 = (char *)&local_2c8;
  local_2c8 = 0x75;
  local_2d0 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2d8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,vec);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_2dms, coord, 1, ",0x28);
  local_2f8 = (char *)&local_2e8;
  local_2e8 = 0x75;
  local_2f0 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2f8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,vec);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_2dms, coord, 2, ",0x28);
  local_318 = (char *)&local_308;
  local_308 = 0x75;
  local_310 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_318,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,vec);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_2dms, coord, 3, ",0x28);
  local_338 = (char *)&local_328;
  local_328 = 0x75;
  local_330 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_338,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,vec);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 0, ",0x38);
  local_358 = (char *)&local_348;
  local_348 = 0x75;
  local_350 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_358,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,vec);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 1, ",0x38);
  local_378 = (char *)&local_368;
  local_368 = 0x75;
  local_370 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_378,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,vec);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 2, ",0x38);
  local_398 = (char *)&local_388;
  local_388 = 0x75;
  local_390 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_398,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,vec);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 3, ",0x38);
  local_3b8 = (char *)&local_3a8;
  local_3a8 = 0x75;
  local_3b0 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_3b8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,vec);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 0, ",0x38);
  local_1f8 = 0x75;
  local_200 = 1;
  local_208 = (char *)&local_1f8;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_1f8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,vec);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 1, ",0x38);
  local_218 = 0x75;
  local_220 = 1;
  local_228 = (char *)&local_218;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_218,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,vec);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 2, ",0x38);
  local_248 = (char *)&local_238;
  local_238 = 0x75;
  local_240 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_248,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,vec);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 3, ",0x38);
  local_1b8 = 0x75;
  local_1c0 = 1;
  local_1c8 = (char *)&local_1b8;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_1b8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,vec);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,");\n  discard;\n}",0xf);
  if (local_1c8 != (char *)&local_1b8) {
    operator_delete(local_1c8,CONCAT62(uStack_1b6,local_1b8) + 1);
  }
  if (local_248 != (char *)&local_238) {
    operator_delete(local_248,CONCAT62(uStack_236,local_238) + 1);
  }
  if (local_228 != (char *)&local_218) {
    operator_delete(local_228,CONCAT62(uStack_216,local_218) + 1);
  }
  if (local_208 != (char *)&local_1f8) {
    operator_delete(local_208,CONCAT62(uStack_1f6,local_1f8) + 1);
  }
  if (local_3b8 != (char *)&local_3a8) {
    operator_delete(local_3b8,CONCAT62(uStack_3a6,local_3a8) + 1);
  }
  if (local_398 != (char *)&local_388) {
    operator_delete(local_398,CONCAT62(uStack_386,local_388) + 1);
  }
  if (local_378 != (char *)&local_368) {
    operator_delete(local_378,CONCAT62(uStack_366,local_368) + 1);
  }
  if (local_358 != (char *)&local_348) {
    operator_delete(local_358,CONCAT62(uStack_346,local_348) + 1);
  }
  if (local_338 != (char *)&local_328) {
    operator_delete(local_338,CONCAT62(uStack_326,local_328) + 1);
  }
  if (local_318 != (char *)&local_308) {
    operator_delete(local_318,CONCAT62(uStack_306,local_308) + 1);
  }
  if (local_2f8 != (char *)&local_2e8) {
    operator_delete(local_2f8,CONCAT62(uStack_2e6,local_2e8) + 1);
  }
  if (local_2d8 != (char *)&local_2c8) {
    operator_delete(local_2d8,CONCAT62(uStack_2c6,local_2c8) + 1);
  }
  if (local_2b8 != (char *)&local_2a8) {
    operator_delete(local_2b8,CONCAT62(uStack_2a6,local_2a8) + 1);
  }
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  if (local_278 != (char *)&local_268) {
    operator_delete(local_278,CONCAT62(uStack_266,local_268) + 1);
  }
  if (textures != (GLuint  [2])&local_3c8) {
    operator_delete((void *)textures,local_3c8 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  GVar2 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                    ((ShaderImageLoadStoreBase *)local_258,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_1e8,(bool *)0x0);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&os,"#version 420 core\nlayout(location = 0) out vec4 o_color;\nuniform ",
             0x41);
  textures = (GLuint  [2])&local_3c8;
  local_3c8 = CONCAT62(local_3c8._2_6_,0x75);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,(char *)textures,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"sampler2DMS g_sampler_2dms;\nuniform ",0x24);
  local_278 = (char *)&local_268;
  local_268 = 0x75;
  local_270 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_278,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "sampler2DMSArray g_sampler_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (texelFetch(g_sampler_2dms, coord, 0) != "
             ,0xb1);
  local_298 = &local_288;
  local_288 = CONCAT62(local_288._2_6_,0x75);
  local_290 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_298,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,write_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 1) != "
             ,0x54);
  local_2b8 = (char *)&local_2a8;
  local_2a8 = 0x75;
  local_2b0 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2b8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,write_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 2) != "
             ,0x54);
  local_2d8 = (char *)&local_2c8;
  local_2c8 = 0x75;
  local_2d0 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2d8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,write_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 3) != "
             ,0x54);
  local_2f8 = (char *)&local_2e8;
  local_2e8 = 0x75;
  local_2f0 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2f8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,write_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 0) != "
             ,100);
  local_318 = (char *)&local_308;
  local_308 = 0x75;
  local_310 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_318,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,write_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 1) != "
             ,100);
  local_338 = (char *)&local_328;
  local_328 = 0x75;
  local_330 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_338,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,write_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 2) != "
             ,100);
  local_358 = (char *)&local_348;
  local_348 = 0x75;
  local_350 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_358,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,write_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 3) != "
             ,100);
  local_378 = (char *)&local_368;
  local_368 = 0x75;
  local_370 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_378,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,write_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 0) != "
             ,100);
  local_398 = (char *)&local_388;
  local_388 = 0x75;
  local_390 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_398,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,write_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 1) != "
             ,100);
  local_3b8 = (char *)&local_3a8;
  local_3a8 = 0x75;
  local_3b0 = 1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_3b8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,write_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 2) != "
             ,100);
  local_1f8 = 0x75;
  local_200 = 1;
  local_208 = (char *)&local_1f8;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_1f8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,write_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 3) != "
             ,100);
  local_218 = 0x75;
  local_220 = 1;
  local_228 = (char *)&local_218;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_218,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,write_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n}",0x27);
  if (local_228 != (char *)&local_218) {
    operator_delete(local_228,CONCAT62(uStack_216,local_218) + 1);
  }
  if (local_208 != (char *)&local_1f8) {
    operator_delete(local_208,CONCAT62(uStack_1f6,local_1f8) + 1);
  }
  if (local_3b8 != (char *)&local_3a8) {
    operator_delete(local_3b8,CONCAT62(uStack_3a6,local_3a8) + 1);
  }
  if (local_398 != (char *)&local_388) {
    operator_delete(local_398,CONCAT62(uStack_386,local_388) + 1);
  }
  if (local_378 != (char *)&local_368) {
    operator_delete(local_378,CONCAT62(uStack_366,local_368) + 1);
  }
  if (local_358 != (char *)&local_348) {
    operator_delete(local_358,CONCAT62(uStack_346,local_348) + 1);
  }
  if (local_338 != (char *)&local_328) {
    operator_delete(local_338,CONCAT62(uStack_326,local_328) + 1);
  }
  if (local_318 != (char *)&local_308) {
    operator_delete(local_318,CONCAT62(uStack_306,local_308) + 1);
  }
  if (local_2f8 != (char *)&local_2e8) {
    operator_delete(local_2f8,CONCAT62(uStack_2e6,local_2e8) + 1);
  }
  if (local_2d8 != (char *)&local_2c8) {
    operator_delete(local_2d8,CONCAT62(uStack_2c6,local_2c8) + 1);
  }
  if (local_2b8 != (char *)&local_2a8) {
    operator_delete(local_2b8,CONCAT62(uStack_2a6,local_2a8) + 1);
  }
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  if (local_278 != (char *)&local_268) {
    operator_delete(local_278,CONCAT62(uStack_266,local_268) + 1);
  }
  if (textures != (GLuint  [2])&local_3c8) {
    operator_delete((void *)textures,local_3c8 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  program = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                      ((ShaderImageLoadStoreBase *)local_258,
                       "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                       ,(char *)0x0,(char *)0x0,(char *)0x0,local_248,(bool *)0x0);
  local_24c = GVar2;
  if (local_248 != (char *)&local_238) {
    operator_delete(local_248,CONCAT62(uStack_236,local_238) + 1);
  }
  this_01 = local_258;
  this_00 = (CallLogWrapper *)(local_258 + 8);
  glu::CallLogWrapper::glGenTextures(this_00,2,textures);
  glu::CallLogWrapper::glBindTexture(this_00,0x9100,textures[0]);
  glu::CallLogWrapper::glTexImage2DMultisample(this_00,0x9100,4,0x8d70,0x10,0x10,'\0');
  glu::CallLogWrapper::glBindTexture(this_00,0x9100,0);
  glu::CallLogWrapper::glBindTexture(this_00,0x9102,textures[1]);
  glu::CallLogWrapper::glTexImage3DMultisample(this_00,0x9102,4,0x8d70,0x10,0x10,2,'\0');
  glu::CallLogWrapper::glBindTexture(this_00,0x9102,0);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,textures[0],0,'\0',0,0x88b9,0x8d70);
  expected = (vec4 *)0x0;
  glu::CallLogWrapper::glBindImageTexture(this_00,4,textures[1],0,'\x01',0,0x88b9,0x8d70);
  glu::CallLogWrapper::glClear(this_00,0x4000);
  GVar2 = local_24c;
  glu::CallLogWrapper::glUseProgram(this_00,local_24c);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar2,"g_image_2dms");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,1);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar2,"g_image_2dms_array");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,4);
  glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(this_01 + 0x28));
  glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
  glu::CallLogWrapper::glBindTexture(this_00,0x9100,textures[0]);
  glu::CallLogWrapper::glActiveTexture(this_00,0x84c1);
  glu::CallLogWrapper::glBindTexture(this_00,0x9102,textures[1]);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_sampler_2dms");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,0);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_sampler_2dms_array");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,1);
  glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(this_01 + 0x28));
  h = 0x10;
  glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x20);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x3f80000000000000;
  os.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0x3f80000000000000;
  bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ValidateReadBuffer
                    ((ShaderImageLoadStoreBase *)this_01,0x10,0x10,(int)&os,h,expected);
  if (!bVar1) {
    gl4cts::anon_unknown_0::Output
              ("GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY target failed.\n");
  }
  glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
  glu::CallLogWrapper::glDeleteTextures(this_00,2,textures);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,GVar2);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  return bVar1;
}

Assistant:

bool WriteMS(GLenum internalformat, const T& write_value, const T& expected_value)
	{

		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const GLuint program	 = BuildProgram(src_vs, NULL, NULL, NULL, GenFSMS(internalformat, write_value).c_str());
		const GLuint val_program = BuildProgram(src_vs, NULL, NULL, NULL, GenFSMSVal(expected_value).c_str());
		GLuint		 textures[2];
		glGenTextures(2, textures);

		const int kSize = 16;

		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, textures[0]);
		glTexImage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 4, internalformat, kSize, kSize, GL_FALSE);
		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);

		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, textures[1]);
		glTexImage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, 4, internalformat, kSize, kSize, 2, GL_FALSE);
		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, 0);

		glBindImageTexture(1, textures[0], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(4, textures[1], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image_2dms"), 1);
		glUniform1i(glGetUniformLocation(program, "g_image_2dms_array"), 4);

		glBindVertexArray(m_vao);
		glViewport(0, 0, kSize, kSize);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		bool status = true;

		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, textures[0]);
		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, textures[1]);

		glUseProgram(val_program);
		glUniform1i(glGetUniformLocation(val_program, "g_sampler_2dms"), 0);
		glUniform1i(glGetUniformLocation(val_program, "g_sampler_2dms_array"), 1);

		glBindVertexArray(m_vao);
		glViewport(0, 0, kSize, kSize);
		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		if (!ValidateReadBuffer(0, 0, kSize, kSize, vec4(0, 1, 0, 1)))
		{
			status = false;
			Output("GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY target failed.\n");
		}

		glActiveTexture(GL_TEXTURE0);
		glDeleteTextures(2, textures);
		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteProgram(val_program);

		return status;
	}